

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

axbStatus_t check_equal_scalar(axbScalar_s *alpha,double a,char *test_desc)

{
  axbStatus_t aVar1;
  double dVar2;
  double rel_diff;
  double dStack_30;
  int err_check_12388123;
  double t;
  char *test_desc_local;
  double a_local;
  axbScalar_s *alpha_local;
  
  t = (double)test_desc;
  test_desc_local = (char *)a;
  a_local = (double)alpha;
  aVar1 = axbScalarGetValue(alpha,&stack0xffffffffffffffd0,AXB_REAL_DOUBLE);
  if (aVar1 == 0) {
    dVar2 = get_rel_diff(dStack_30,(double)test_desc_local);
    if (1e-13 < dVar2) {
      fprintf(_stderr,
              "ERROR: Test %s failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n"
              ,dVar2,test_desc_local,dStack_30,t);
      exit(1);
    }
    printf("PASSED: Test %s\n",t);
    alpha_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Failure in line %d in file %s\n",0x1a,
            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
           );
    alpha_local._4_4_ = aVar1;
  }
  return alpha_local._4_4_;
}

Assistant:

axbStatus_t check_equal_scalar(const struct axbScalar_s *alpha, double a, const char *test_desc)
{
  double t;
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &t, AXB_REAL_DOUBLE));

  double rel_diff = get_rel_diff(t, a);
  if (rel_diff > TEST_EPSILON) {
    fprintf(stderr, "ERROR: Test %s failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n", test_desc, rel_diff, a, t);
    exit(EXIT_FAILURE);
  }

  printf("PASSED: Test %s\n", test_desc);
  return 0;
}